

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.cpp
# Opt level: O0

void __thiscall csv::internals::IBasicCSVParser::end_feed(IBasicCSVParser *this)

{
  bool bVar1;
  ParseFlags PVar2;
  element_type *peVar3;
  const_reference pvVar4;
  size_t sVar5;
  bool bVar6;
  bool empty_last_field;
  IBasicCSVParser *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->data_ptr);
  bVar6 = false;
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->data_ptr);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)peVar3);
    bVar6 = false;
    if (bVar1) {
      peVar3 = std::
               __shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->data_ptr);
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&peVar3->data);
      bVar6 = false;
      if (!bVar1) {
        peVar3 = std::
                 __shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->data_ptr);
        pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::back(&peVar3->data);
        PVar2 = parse_flag(this,*pvVar4);
        bVar6 = true;
        if (PVar2 != DELIMITER) {
          peVar3 = std::
                   __shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->data_ptr);
          pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::back(&peVar3->data);
          PVar2 = parse_flag(this,*pvVar4);
          bVar6 = PVar2 == QUOTE;
        }
      }
    }
  }
  if ((this->field_length != 0) || (bVar6)) {
    push_field(this);
  }
  sVar5 = CSVRow::size(&this->current_row);
  if (sVar5 != 0) {
    push_row(this);
  }
  return;
}

Assistant:

CSV_INLINE void IBasicCSVParser::end_feed() {
            using internals::ParseFlags;

            bool empty_last_field = this->data_ptr
                && this->data_ptr->_data
                && !this->data_ptr->data.empty()
                && (parse_flag(this->data_ptr->data.back()) == ParseFlags::DELIMITER
                    || parse_flag(this->data_ptr->data.back()) == ParseFlags::QUOTE);

            // Push field
            if (this->field_length > 0 || empty_last_field) {
                this->push_field();
            }

            // Push row
            if (this->current_row.size() > 0)
                this->push_row();
        }